

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O2

void __thiscall leveldb::TestState::TestState(TestState *this,int s)

{
  ConcurrentTest::ConcurrentTest(&this->t_);
  this->seed_ = s;
  (this->quit_flag_)._M_base._M_i = false;
  (this->mu_).mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mu_).mu_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mu_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mu_).mu_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mu_).mu_.super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0;
  *(undefined8 *)((long)&(this->mu_).mu_.super___mutex_base._M_mutex.__data.__list.__next + 4) = 0;
  std::condition_variable::condition_variable(&(this->state_cv_).cv_);
  (this->state_cv_).mu_ = &this->mu_;
  return;
}

Assistant:

explicit TestState(int s)
      : seed_(s), quit_flag_(false), state_(STARTING), state_cv_(&mu_) {}